

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

int __thiscall
CVmObjStringBuffer::index_val_q
          (CVmObjStringBuffer *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *index_val)

{
  int32_t iVar1;
  vm_strbuf_ext *pvVar2;
  undefined8 in_RSI;
  vm_val_t *in_RDI;
  CVmObjStringBuffer *unaff_retaddr;
  int32_t idx;
  int local_34;
  vm_val_t *new_str;
  
  new_str = in_RDI;
  iVar1 = vm_val_t::num_to_int(in_RDI);
  if (iVar1 < 0) {
    pvVar2 = get_ext((CVmObjStringBuffer *)in_RDI);
    local_34 = pvVar2->len;
  }
  else {
    local_34 = -1;
  }
  if (-1 < local_34 + iVar1) {
    pvVar2 = get_ext((CVmObjStringBuffer *)in_RDI);
    if (local_34 + iVar1 < pvVar2->len) {
      substr_to_string(unaff_retaddr,new_str,(int32_t)((ulong)in_RSI >> 0x20),(int32_t)in_RSI);
      return 1;
    }
  }
  err_throw(0);
}

Assistant:

int CVmObjStringBuffer::index_val_q(VMG_ vm_val_t *result, vm_obj_id_t self,
                                    const vm_val_t *index_val)
{
    /* get the index as an integer */
    int32_t idx = index_val->num_to_int(vmg0_);

    /* adjust to zero-based indexing or a negative end-based index */
    idx += (idx < 0 ? get_ext()->len : -1);

    /* ensure idx is in range */
    if (idx < 0 || idx >= (int32_t)get_ext()->len)
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* return a one-character string of the character at this index */
    substr_to_string(vmg_ result, idx, 1);

    /* handled */
    return TRUE;
}